

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::RemoveFieldInfo::Deserialize(RemoveFieldInfo *this,Deserializer *deserializer)

{
  RemoveFieldInfo *this_00;
  pointer pRVar1;
  _Head_base<0UL,_duckdb::RemoveFieldInfo_*,_false> local_20;
  
  this_00 = (RemoveFieldInfo *)operator_new(0x98);
  RemoveFieldInfo(this_00);
  local_20._M_head_impl = this_00;
  pRVar1 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (deserializer,400,"column_path",&pRVar1->column_path);
  pRVar1 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0x191,"if_column_exists",&pRVar1->if_column_exists);
  pRVar1 = unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>::
           operator->((unique_ptr<duckdb::RemoveFieldInfo,_std::default_delete<duckdb::RemoveFieldInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0x192,"cascade",&pRVar1->cascade);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> RemoveFieldInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<RemoveFieldInfo>(new RemoveFieldInfo());
	deserializer.ReadPropertyWithDefault<vector<string>>(400, "column_path", result->column_path);
	deserializer.ReadPropertyWithDefault<bool>(401, "if_column_exists", result->if_column_exists);
	deserializer.ReadPropertyWithDefault<bool>(402, "cascade", result->cascade);
	return std::move(result);
}